

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_string(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  tag_t<cfgfile::string_trait_t> **pptVar1;
  pointer pcVar2;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  _Var3;
  exception_t<cfgfile::string_trait_t> *this_00;
  pos_t pos;
  string_t value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string_t local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pptVar1 = (this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::string_trait_t>::is_any_child_defined()const::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>*)_1_>>
                    ((this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,pptVar1);
  if (_Var3._M_current == pptVar1) {
    pcVar2 = (str->_M_dataplus)._M_p;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar2,pcVar2 + str->_M_string_length);
    std::__cxx11::string::_M_append((char *)&this->m_value,(ulong)local_290._M_dataplus._M_p);
    (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Value \"","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_270,local_270 + local_268);
  std::operator+(&local_110,&local_150,str);
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"\" for tag \"","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_190,local_190 + local_188);
  std::operator+(&local_f0,&local_110,&local_170);
  std::operator+(&local_d0,&local_f0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"\" must be defined before any child tag. In file \"","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,local_210,local_210 + local_208);
  std::operator+(&local_b0,&local_d0,&local_1b0);
  std::operator+(&local_90,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)info);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"\" on line ","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,local_230,local_230 + local_228);
  std::operator+(&local_70,&local_90,&local_1d0);
  string_trait_t::to_string_abi_cxx11_(&local_130,*(string_trait_t **)(info + 0x20),pos);
  std::operator+(&local_290,&local_70,&local_130);
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,".","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_250,local_250 + local_248);
  std::operator+(&local_50,&local_290,&local_1f0);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any child "
					"tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const typename Trait::string_t value =
			format_t< typename Trait::string_t, Trait >::from_string( info, str );

		m_value.append( value );

		this->set_defined();
	}